

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O2

string * __thiscall
vkt::SpirVAssembly::getTypeName_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType type)

{
  IntegerType type_00;
  char *__s;
  string prefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_78;
  string local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  __s = "u";
  if ((int)this < 3) {
    __s = "";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,__s,(allocator<char> *)&bStack_78);
  std::operator+(&bStack_78,&local_38,"int");
  getBitWidthStr_abi_cxx11_(&local_58,(SpirVAssembly *)((ulong)this & 0xffffffff),type_00);
  std::operator+(__return_storage_ptr__,&bStack_78,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::~string((string *)&bStack_78);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

const string getTypeName (IntegerType type)
{
	string prefix = isSigned(type) ? "" : "u";
	return prefix + "int" + getBitWidthStr(type);
}